

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall VarnodeListSymbol::checkTableFill(VarnodeListSymbol *this)

{
  pointer ppVVar1;
  pointer ppVVar2;
  int iVar3;
  int extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  (*(((this->super_ValueSymbol).patval)->super_PatternExpression)._vptr_PatternExpression[10])();
  iVar3 = (*(((this->super_ValueSymbol).patval)->super_PatternExpression)._vptr_PatternExpression
            [0xb])();
  if (extraout_var < 0) {
    bVar6 = false;
  }
  else {
    bVar6 = CONCAT44(extraout_var_00,iVar3) <
            (ulong)((long)(this->varnode_table).
                          super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->varnode_table).
                          super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  ppVVar1 = (this->varnode_table).
            super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar2 = (this->varnode_table).
            super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this->tableisfilled = bVar6;
  lVar4 = (long)ppVVar2 - (long)ppVVar1;
  if (lVar4 != 0) {
    uVar5 = 0;
    do {
      if (ppVVar1[uVar5] == (VarnodeSymbol *)0x0) {
        this->tableisfilled = false;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)(lVar4 >> 3));
  }
  return;
}

Assistant:

void VarnodeListSymbol::checkTableFill(void)

{
  intb min = patval->minValue();
  intb max = patval->maxValue();
  tableisfilled = (min>=0)&&(max<varnode_table.size());
  for(uint4 i=0;i<varnode_table.size();++i) {
    if (varnode_table[i] == (VarnodeSymbol *)0)
      tableisfilled = false;
  }
}